

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_char(uint32_t value)

{
  LOGGER_LOG p_Var1;
  undefined4 *puVar2;
  int iVar3;
  char *pcVar4;
  
  if (value < 0x110000) {
    puVar2 = (undefined4 *)malloc(0x20);
    if (puVar2 != (undefined4 *)0x0) {
      *puVar2 = 1;
      puVar2[2] = 0xd;
      puVar2[4] = value;
      return (AMQP_VALUE)(puVar2 + 2);
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar4 = "Could not allocate memory for AMQP value";
    iVar3 = 0x333;
  }
  else {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return (AMQP_VALUE)0x0;
    }
    pcVar4 = "Invalid value for a Unicode char";
    iVar3 = 0x32a;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
            ,"amqpvalue_create_char",iVar3,1,pcVar4);
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_create_char(uint32_t value)
{
    AMQP_VALUE result;

    /* Codes_SRS_AMQPVALUE_01_098: [If the code point value is outside of the allowed range [0, 0x10FFFF] then amqpvalue_create_char shall return NULL.] */
    if (value > 0x10FFFF)
    {
        LogError("Invalid value for a Unicode char");
        result = NULL;
    }
    else
    {
        result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
        if (result == NULL)
        {
            /* Codes_SRS_AMQPVALUE_01_093: [If allocating the AMQP_VALUE fails then amqpvalue_create_char shall return NULL.] */
            LogError("Could not allocate memory for AMQP value");
        }
        else
        {
            /* Codes_SRS_AMQPVALUE_01_092: [amqpvalue_create_char shall return a handle to an AMQP_VALUE that stores a single UTF-32 character value.] */
            result->type = AMQP_TYPE_CHAR;
            result->value.char_value = value;
        }
    }

    return result;
}